

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axis_property.c
# Opt level: O3

int mpt_axis_get(mpt_axis *ax,mpt_property *pr)

{
  undefined8 uVar1;
  char *pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  char *elem_name [10];
  undefined8 local_68 [11];
  
  if (pr == (mpt_property *)0x0) {
    if (mpt_axis_pointer_typeid::ptype != 0) {
      return mpt_axis_pointer_typeid::ptype;
    }
    iVar7 = mpt_type_add(&mpt_axis_pointer_typeid::traits);
    if (iVar7 < 1) {
      return iVar7;
    }
    mpt_axis_pointer_typeid::ptype = iVar7;
    return iVar7;
  }
  pcVar2 = pr->name;
  if (pcVar2 == (char *)0x0) {
    uVar6 = *(uint *)&pr->desc;
    if (9 < uVar6) {
      return -1;
    }
  }
  else {
    if (*pcVar2 == '\0') {
      pr->name = "axis";
      pr->desc = "mpt axis data";
      (pr->val)._addr = "sddfnyyyycc";
      (pr->val)._type = 0;
      if (ax != (mpt_axis *)0x0) {
        iVar7 = bcmp(ax,&def_axis,0x28);
        return (uint)(iVar7 != 0);
      }
      return 0;
    }
    lVar8 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&mpt_axis_get::elem[1].name + lVar8 * 4);
      *(undefined8 *)((long)local_68 + lVar8) =
           *(undefined8 *)((long)&mpt_axis_get::elem[0].name + lVar8 * 4);
      *(undefined8 *)((long)local_68 + lVar8 + 8) = uVar1;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x50);
    uVar6 = mpt_property_match(pcVar2,3,local_68,10);
    if ((int)uVar6 < 0) {
      return -1;
    }
  }
  uVar3 = *(undefined4 *)((long)&mpt_axis_get::elem[uVar6].name + 4);
  uVar4 = *(undefined4 *)&mpt_axis_get::elem[uVar6].desc;
  uVar5 = *(undefined4 *)((long)&mpt_axis_get::elem[uVar6].desc + 4);
  *(undefined4 *)&pr->name = *(undefined4 *)&mpt_axis_get::elem[uVar6].name;
  *(undefined4 *)((long)&pr->name + 4) = uVar3;
  *(undefined4 *)&pr->desc = uVar4;
  *(undefined4 *)((long)&pr->desc + 4) = uVar5;
  if (ax == (mpt_axis *)0x0) {
    (pr->val)._addr = (void *)mpt_axis_get::elem[uVar6].off;
    (pr->val)._type = (long)mpt_axis_get::elem[uVar6].type;
  }
  else {
    if ((uVar6 == 5) && ((ax->format & 0x20) != 0)) {
      (pr->val)._type = 0x73;
      *(char **)pr->_buf = "log";
      (pr->val)._addr = pr->_buf;
      sVar9 = mpt_axis_get::elem[uVar6].off;
    }
    else {
      sVar9 = mpt_axis_get::elem[uVar6].off;
      (pr->val)._addr = (void *)((long)&ax->_title + sVar9);
      (pr->val)._type = (long)mpt_axis_get::elem[uVar6].type;
    }
    uVar6 = mpt_value_compare(&pr->val,(long)&def_axis._title + sVar9);
  }
  return uVar6;
}

Assistant:

extern int mpt_axis_get(const MPT_STRUCT(axis) *ax, MPT_STRUCT(property) *pr)
{
	static const struct {
		const char  *name;
		const char  *desc;
		const int    type;
		const size_t off;
	} elem[] = {
		{"title",     "axis title",              's',  MPT_offset(axis, _title) },
		{"begin",     "axis start value",        'd',  MPT_offset(axis, begin) },
		{"end",       "axis end value",          'd',  MPT_offset(axis, end) },
		{"tlen",      "relative tick length ",   'f',  MPT_offset(axis, tlen) },
		{"exponent",  "label exponent",          'n',  MPT_offset(axis, exp) },
		{"intervals", "intervals between ticks", 'y',  MPT_offset(axis, intv) },
		{"subtick",   "intermediate ticks",      'y',  MPT_offset(axis, sub) },
		{"decimals",  "decimal places",          'y',  MPT_offset(axis, dec) },
		{"lpos",      "label direction",         'c',  MPT_offset(axis, lpos) },
		{"tpos",      "title direction",         'c',  MPT_offset(axis, tpos) },
	};
	
	static const uint8_t format[] = {
		's',
		'd', 'd', /* axis range values */
		'f',      /* relative tick length */
		'n',      /* scale value */
		'y', 'y', /* intervals, subintervals */
		'y',      /* axis flags */
		'y',      /* decimals */
		'c', 'c', /* label/title direction */
		0
	};
	int pos;
	
	if (!pr) {
		return mpt_axis_pointer_typeid();
	}
	/* property by position */
	if (!pr->name) {
		pos = (intptr_t) pr->desc;
		if (pos < 0 || pos >= (int) MPT_arrsize(elem)) {
			return MPT_ERROR(BadArgument);
		}
	}
	/* get total type */
	else if (!*pr->name) {
		pr->name = "axis";
		pr->desc = "mpt axis data";
		MPT_value_set(&pr->val, 0, format);
		
		return ax && memcmp(ax, &def_axis, sizeof(*ax)) ? 1 : 0;
	}
	/* find property by name */
	else {
		const char *elem_name[MPT_arrsize(elem)];
		for (pos = 0; pos < (int) MPT_arrsize(elem); pos++) {
			elem_name[pos] = elem[pos].name;
		}
		if ((pos = mpt_property_match(pr->name, 3, elem_name, pos)) < 0) {
			return MPT_ERROR(BadArgument);
		}
	}
	pr->name = elem[pos].name;
	pr->desc = elem[pos].desc;
	
	if (!ax) {
		MPT_value_set(&pr->val, elem[pos].type, ((uint8_t *) ax) + elem[pos].off);
		return pos;
	}
	
	if ((pos == 5) && (ax->format & MPT_ENUM(TransformLg))) {
		static const char desc[] = "log\0";
		MPT_property_set_string(pr, desc);
	} else {
		MPT_value_set(&pr->val, elem[pos].type, ((uint8_t *) ax) + elem[pos].off);
	}
	return mpt_value_compare(&pr->val, ((uint8_t *) &def_axis) + elem[pos].off);
}